

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void * threadsafe_mem_leak_operator_new_array_debug(size_t size,char *file,size_t line)

{
  MemoryLeakDetector *this;
  TestMemoryAllocator *allocator;
  char *pcVar1;
  bad_alloc *this_00;
  void *memory;
  MemLeakScopedMutex lock;
  size_t line_local;
  char *file_local;
  size_t size_local;
  
  lock.lock.mutex = (ScopedMutexLock)(ScopedMutexLock)line;
  MemLeakScopedMutex::MemLeakScopedMutex((MemLeakScopedMutex *)&memory);
  this = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentNewArrayAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory(this,allocator,size,file,(size_t)lock.lock.mutex,false);
  if (pcVar1 == (char *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  MemLeakScopedMutex::~MemLeakScopedMutex((MemLeakScopedMutex *)&memory);
  return pcVar1;
}

Assistant:

UT_THROW(CPPUTEST_BAD_ALLOC)
{
    MemLeakScopedMutex lock;
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewArrayAllocator(), size, file, line);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}